

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O0

int secp256k1_der_parse_integer(secp256k1_scalar *r,uchar **sig,uchar *sigend)

{
  int iVar1;
  ulong local_60;
  size_t rlen;
  uchar ra [32];
  int local_2c;
  uchar *puStack_28;
  int overflow;
  uchar *sigend_local;
  uchar **sig_local;
  secp256k1_scalar *r_local;
  
  local_2c = 0;
  puStack_28 = sigend;
  sigend_local = (uchar *)sig;
  sig_local = (uchar **)r;
  memset(&rlen,0,0x20);
  if ((*(uchar **)sigend_local == puStack_28) || (**(char **)sigend_local != '\x02')) {
    r_local._4_4_ = 0;
  }
  else {
    *(long *)sigend_local = *(long *)sigend_local + 1;
    iVar1 = secp256k1_der_read_len(&local_60,(uchar **)sigend_local,puStack_28);
    if (iVar1 == 0) {
      r_local._4_4_ = 0;
    }
    else if ((local_60 == 0) || (puStack_28 < (uchar *)(*(long *)sigend_local + local_60))) {
      r_local._4_4_ = 0;
    }
    else if ((**(char **)sigend_local == '\0') &&
            ((1 < local_60 && ((*(byte *)(*(long *)sigend_local + 1) & 0x80) == 0)))) {
      r_local._4_4_ = 0;
    }
    else if ((**(char **)sigend_local == -1) &&
            ((1 < local_60 && ((*(byte *)(*(long *)sigend_local + 1) & 0x80) == 0x80)))) {
      r_local._4_4_ = 0;
    }
    else {
      if ((**(byte **)sigend_local & 0x80) == 0x80) {
        local_2c = 1;
      }
      if ((local_60 != 0) && (**(char **)sigend_local == '\0')) {
        local_60 = local_60 - 1;
        *(long *)sigend_local = *(long *)sigend_local + 1;
      }
      if (0x20 < local_60) {
        local_2c = 1;
      }
      if (local_2c == 0) {
        memcpy(ra + (0x18 - local_60),*(void **)sigend_local,local_60);
        secp256k1_scalar_set_b32((secp256k1_scalar *)sig_local,(uchar *)&rlen,&local_2c);
      }
      if (local_2c != 0) {
        secp256k1_scalar_set_int((secp256k1_scalar *)sig_local,0);
      }
      *(ulong *)sigend_local = local_60 + *(long *)sigend_local;
      r_local._4_4_ = 1;
    }
  }
  return r_local._4_4_;
}

Assistant:

static int secp256k1_der_parse_integer(secp256k1_scalar *r, const unsigned char **sig, const unsigned char *sigend) {
    int overflow = 0;
    unsigned char ra[32] = {0};
    size_t rlen;

    if (*sig == sigend || **sig != 0x02) {
        /* Not a primitive integer (X.690-0207 8.3.1). */
        return 0;
    }
    (*sig)++;
    if (secp256k1_der_read_len(&rlen, sig, sigend) == 0) {
        return 0;
    }
    if (rlen == 0 || *sig + rlen > sigend) {
        /* Exceeds bounds or not at least length 1 (X.690-0207 8.3.1).  */
        return 0;
    }
    if (**sig == 0x00 && rlen > 1 && (((*sig)[1]) & 0x80) == 0x00) {
        /* Excessive 0x00 padding. */
        return 0;
    }
    if (**sig == 0xFF && rlen > 1 && (((*sig)[1]) & 0x80) == 0x80) {
        /* Excessive 0xFF padding. */
        return 0;
    }
    if ((**sig & 0x80) == 0x80) {
        /* Negative. */
        overflow = 1;
    }
    /* There is at most one leading zero byte:
     * if there were two leading zero bytes, we would have failed and returned 0
     * because of excessive 0x00 padding already. */
    if (rlen > 0 && **sig == 0) {
        /* Skip leading zero byte */
        rlen--;
        (*sig)++;
    }
    if (rlen > 32) {
        overflow = 1;
    }
    if (!overflow) {
        memcpy(ra + 32 - rlen, *sig, rlen);
        secp256k1_scalar_set_b32(r, ra, &overflow);
    }
    if (overflow) {
        secp256k1_scalar_set_int(r, 0);
    }
    (*sig) += rlen;
    return 1;
}